

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_txn_state(sqlite3 *db,char *zSchema)

{
  Btree *p;
  long in_RSI;
  long in_RDI;
  int x;
  Btree *pBt;
  int iTxn;
  int nDb;
  int iDb;
  undefined4 local_30;
  char *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar1;
  undefined4 local_18;
  undefined4 local_14;
  
  iVar1 = -1;
  sqlite3_mutex_enter((sqlite3_mutex *)0x14afb8);
  if (in_RSI == 0) {
    local_14 = 0;
    local_18 = *(int *)(in_RDI + 0x28) + -1;
  }
  else {
    local_14 = sqlite3FindDbName((sqlite3 *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),
                                 in_stack_ffffffffffffffd8);
    local_18 = local_14;
    if (local_14 < 0) {
      local_18 = local_14 + -1;
    }
  }
  for (; local_14 <= local_18; local_14 = local_14 + 1) {
    p = *(Btree **)(*(long *)(in_RDI + 0x20) + (long)local_14 * 0x20 + 8);
    if (p == (Btree *)0x0) {
      local_30 = 0;
    }
    else {
      local_30 = sqlite3BtreeTxnState(p);
    }
    if (iVar1 < local_30) {
      iVar1 = local_30;
    }
  }
  sqlite3_mutex_leave((sqlite3_mutex *)0x14b083);
  return iVar1;
}

Assistant:

SQLITE_API int sqlite3_txn_state(sqlite3 *db, const char *zSchema){
  int iDb, nDb;
  int iTxn = -1;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ){
    (void)SQLITE_MISUSE_BKPT;
    return -1;
  }
#endif
  sqlite3_mutex_enter(db->mutex);
  if( zSchema ){
    nDb = iDb = sqlite3FindDbName(db, zSchema);
    if( iDb<0 ) nDb--;
  }else{
    iDb = 0;
    nDb = db->nDb-1;
  }
  for(; iDb<=nDb; iDb++){
    Btree *pBt = db->aDb[iDb].pBt;
    int x = pBt!=0 ? sqlite3BtreeTxnState(pBt) : SQLITE_TXN_NONE;
    if( x>iTxn ) iTxn = x;
  }
  sqlite3_mutex_leave(db->mutex);
  return iTxn;
}